

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessage
          (LogMessage *this,Nonnull<const_char_*> file,int line,LogSeverity severity)

{
  pointer pLVar1;
  Nonnull<std::unique_ptr<LogMessageData>_> *this_00;
  undefined1 local_20 [8];
  LogSeverity severity_local;
  int line_local;
  Nonnull<const_char_*> file_local;
  LogMessage *this_local;
  
  local_20._0_4_ = severity;
  local_20._4_4_ = line;
  _severity_local = file;
  file_local = (Nonnull<const_char_*>)this;
  base_internal::ErrnoSaver::ErrnoSaver(&this->errno_saver_);
  Now();
  std::
  make_unique<absl::lts_20250127::log_internal::LogMessage::LogMessageData,char_const*&,int&,absl::lts_20250127::LogSeverity&,absl::lts_20250127::Time>
            ((char **)&this->data_,(int *)&severity_local,(LogSeverity *)(local_20 + 4),
             (Time *)local_20);
  this_00 = &this->data_;
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(this_00);
  pLVar1->first_fatal = false;
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(this_00);
  pLVar1->is_perror = false;
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(this_00);
  pLVar1->fail_quietly = false;
  LogBacktraceIfNeeded(this);
  return;
}

Assistant:

LogMessage::LogMessage(absl::Nonnull<const char*> file, int line,
                       absl::LogSeverity severity)
    : data_(absl::make_unique<LogMessageData>(file, line, severity,
                                              absl::Now())) {
  data_->first_fatal = false;
  data_->is_perror = false;
  data_->fail_quietly = false;

  // This logs a backtrace even if the location is subsequently changed using
  // AtLocation.  This quirk, and the behavior when AtLocation is called twice,
  // are fixable but probably not worth fixing.
  LogBacktraceIfNeeded();
}